

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O3

bool __thiscall ON_3dmRevisionHistory::IsValid(ON_3dmRevisionHistory *this)

{
  bool bVar1;
  int iVar2;
  tm jan_1_1970;
  tm local_48;
  
  local_48.tm_sec = 0;
  local_48.tm_min = 0;
  local_48.tm_wday = 0;
  local_48.tm_yday = 0;
  local_48.tm_isdst = 0;
  local_48._36_4_ = 0;
  local_48.tm_gmtoff = 0;
  local_48.tm_zone = (char *)0x0;
  local_48.tm_hour = 0;
  local_48.tm_mday = 1;
  local_48.tm_mon = 0;
  local_48.tm_year = 0x46;
  iVar2 = ON_CompareRevisionHistoryTime(&local_48,&this->m_last_edit_time);
  if (iVar2 < 1) {
    iVar2 = ON_CompareRevisionHistoryTime(&this->m_create_time,&this->m_last_edit_time);
    bVar1 = iVar2 < 1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_3dmRevisionHistory::IsValid() const
{
  return (     LastEditedTimeIsSet() 
            && ON_CompareRevisionHistoryTime(&m_create_time, &m_last_edit_time) <= 0
         );
}